

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.h
# Opt level: O2

char * __thiscall CNscContext::GetDefineValue(CNscContext *this,char *pszDefine)

{
  iterator iVar1;
  string *psVar2;
  pointer pcVar3;
  key_type local_28;
  
  local_28.psz = pszDefine;
  local_28.nLength = strlen(pszDefine);
  iVar1 = std::
          _Hashtable<CNscContext::FastHashMapStr,_std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<CNscContext::FastHashMapStr>,_CNscContext::FastHashMapStrHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_cDefineLookup)._M_h,&local_28);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    psVar2 = GetDefineValue_abi_cxx11_
                       (this,*(DefineEntry **)
                              ((long)iVar1.
                                     super__Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
                                     ._M_cur + 0x18),true);
    pcVar3 = (psVar2->_M_dataplus)._M_p;
  }
  return pcVar3;
}

Assistant:

const char *GetDefineValue (const char *pszDefine)
	{
		DefineLookupMap::const_iterator it = m_cDefineLookup .find (pszDefine);

		if (it == m_cDefineLookup .end ())
			return NULL;

		return GetDefineValue (it ->second) ->c_str ();
	}